

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_fixup_pass.h
# Opt level: O0

Analysis __thiscall spvtools::opt::InterpFixupPass::GetPreservedAnalyses(InterpFixupPass *this)

{
  Analysis AVar1;
  InterpFixupPass *this_local;
  
  AVar1 = operator|(kAnalysisInstrToBlockMapping,kAnalysisDecorations);
  AVar1 = operator|(AVar1,kAnalysisCombinators);
  AVar1 = operator|(AVar1,kAnalysisCFG);
  AVar1 = operator|(AVar1,kAnalysisDominatorAnalysis);
  AVar1 = operator|(AVar1,kAnalysisLoopAnalysis);
  AVar1 = operator|(AVar1,kAnalysisNameMap);
  AVar1 = operator|(AVar1,kAnalysisScalarEvolution);
  AVar1 = operator|(AVar1,kAnalysisRegisterPressure);
  AVar1 = operator|(AVar1,kAnalysisValueNumberTable);
  AVar1 = operator|(AVar1,kAnalysisStructuredCFG);
  AVar1 = operator|(AVar1,kAnalysisBuiltinVarId);
  AVar1 = operator|(AVar1,kAnalysisIdToFuncMapping);
  AVar1 = operator|(AVar1,kAnalysisTypes);
  AVar1 = operator|(AVar1,kAnalysisBegin);
  AVar1 = operator|(AVar1,kAnalysisConstants);
  return AVar1;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisDecorations | IRContext::kAnalysisCombinators |
           IRContext::kAnalysisCFG | IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisScalarEvolution |
           IRContext::kAnalysisRegisterPressure |
           IRContext::kAnalysisValueNumberTable |
           IRContext::kAnalysisStructuredCFG |
           IRContext::kAnalysisBuiltinVarId |
           IRContext::kAnalysisIdToFuncMapping | IRContext::kAnalysisTypes |
           IRContext::kAnalysisDefUse | IRContext::kAnalysisConstants;
  }